

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O2

compiler_token_type __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
get_charset_token<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,char **begin,char *end)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  compiler_token_type cVar5;
  
  pcVar3 = *begin;
  cVar2 = *pcVar3;
  lVar4 = 1;
  switch(cVar2) {
  case '[':
    pcVar1 = pcVar3 + 1;
    if (pcVar1 == end) {
      return token_literal;
    }
    detail::ensure_(*pcVar1 != '=',error_collate,"equivalence classes are not yet supported",
                    "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_charset_token(FwdIter &, FwdIter) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                    ,0x135);
    detail::ensure_(*pcVar1 != '.',error_collate,"collation sequences are not yet supported",
                    "regex_constants::compiler_token_type boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>::get_charset_token(FwdIter &, FwdIter) [RegexTraits = boost::xpressive::regex_traits<char>, FwdIter = const char *]"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/detail/dynamic/parser_traits.hpp"
                    ,0x13b);
    if (*pcVar1 != ':') {
      return token_literal;
    }
    cVar5 = token_posix_charset_begin;
    break;
  case '\\':
    pcVar1 = pcVar3 + 1;
    *begin = pcVar1;
    if (pcVar1 == end) {
      return token_escape;
    }
    if (*pcVar1 != 'b') {
      return token_escape;
    }
    cVar5 = token_charset_backspace;
    break;
  case ']':
    cVar5 = token_charset_end;
    goto LAB_0012f077;
  case '^':
    cVar5 = token_charset_invert;
    goto LAB_0012f077;
  default:
    if (cVar2 != ':') {
      if (cVar2 != '-') {
        return token_literal;
      }
      cVar5 = token_charset_hyphen;
      goto LAB_0012f077;
    }
    if (pcVar3 + 1 == end) {
      return token_literal;
    }
    if (pcVar3[1] != ']') {
      return token_literal;
    }
    cVar5 = token_posix_charset_end;
  }
  lVar4 = 2;
LAB_0012f077:
  *begin = pcVar3 + lVar4;
  return cVar5;
}

Assistant:

regex_constants::compiler_token_type get_charset_token(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        BOOST_ASSERT(begin != end);
        switch(*begin)
        {
        case BOOST_XPR_CHAR_(char_type, '^'): ++begin; return token_charset_invert;
        case BOOST_XPR_CHAR_(char_type, '-'): ++begin; return token_charset_hyphen;
        case BOOST_XPR_CHAR_(char_type, ']'): ++begin; return token_charset_end;
        case BOOST_XPR_CHAR_(char_type, '['):
            {
                FwdIter next = begin; ++next;
                if(next != end)
                {
                    BOOST_XPR_ENSURE_(
                        *next != BOOST_XPR_CHAR_(char_type, '=')
                      , error_collate
                      , "equivalence classes are not yet supported"
                    );

                    BOOST_XPR_ENSURE_(
                        *next != BOOST_XPR_CHAR_(char_type, '.')
                      , error_collate
                      , "collation sequences are not yet supported"
                    );

                    if(*next == BOOST_XPR_CHAR_(char_type, ':'))
                    {
                        begin = ++next;
                        return token_posix_charset_begin;
                    }
                }
            }
            break;
        case BOOST_XPR_CHAR_(char_type, ':'):
            {
                FwdIter next = begin; ++next;
                if(next != end && *next == BOOST_XPR_CHAR_(char_type, ']'))
                {
                    begin = ++next;
                    return token_posix_charset_end;
                }
            }
            break;
        case BOOST_XPR_CHAR_(char_type, '\\'):
            if(++begin != end)
            {
                switch(*begin)
                {
                case BOOST_XPR_CHAR_(char_type, 'b'): ++begin; return token_charset_backspace;
                default:;
                }
            }
            return token_escape;
        default:;
        }
        return token_literal;
    }